

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O1

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *popped_item)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->queue_mutex_;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if ((this->q_).tail_ == (this->q_).head_) {
    do {
      std::condition_variable::wait((unique_lock *)&this->push_cv_);
    } while ((this->q_).tail_ == (this->q_).head_);
  }
  async_msg::operator=
            (popped_item,
             (this->q_).v_.
             super__Vector_base<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_>
             ._M_impl.super__Vector_impl_data._M_start + (this->q_).head_);
  (this->q_).head_ = ((this->q_).head_ + 1) % (this->q_).max_items_;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void dequeue(T &popped_item) {
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            push_cv_.wait(lock, [this] { return !this->q_.empty(); });
            popped_item = std::move(q_.front());
            q_.pop_front();
        }
        pop_cv_.notify_one();
    }